

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

InterfaceHandle __thiscall
helics::CommonCore::registerTranslator
          (CommonCore *this,string_view translatorName,string_view endpointType,string_view units)

{
  GlobalFederateId global_federateId;
  BaseType BVar1;
  BrokerObject *__src;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar2;
  ActionMessage reg;
  ActionMessage local_e8;
  
  checkNewInterface(this,(LocalFederateId)0xfffffefd,translatorName,TRANSLATOR);
  global_federateId.gid = (this->translatorFedID)._M_i.gid;
  puVar2 = createBasicHandle(this,global_federateId,(LocalFederateId)0x88ca6c00,TRANSLATOR,
                             translatorName,endpointType,units,0);
  BVar1 = *(BaseType *)
           ((long)&(puVar2->_M_t).
                   super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                   .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4);
  ActionMessage::ActionMessage(&local_e8,cmd_reg_translator);
  __src = puVar2[2]._M_t.
          super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>.
          _M_t.
          super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
          .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  local_e8.payload.bufferSize =
       (size_t)puVar2[3]._M_t.
               super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
               .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
  local_e8.source_id.gid = global_federateId.gid;
  local_e8.source_handle.hid = BVar1;
  if (((BrokerObject *)local_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&local_e8.payload,local_e8.payload.bufferSize),
     (BrokerObject *)local_e8.payload.bufferSize != (BrokerObject *)0x0)) {
    memcpy(local_e8.payload.heap,__src,local_e8.payload.bufferSize);
  }
  if (units._M_len != 0 || endpointType._M_len != 0) {
    ActionMessage::setStringData(&local_e8,endpointType,units);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&local_e8);
  ActionMessage::~ActionMessage(&local_e8);
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::registerTranslator(std::string_view translatorName,
                                               std::string_view endpointType,
                                               std::string_view units)
{
    // check to make sure the name isn't already used
    checkNewInterface(gLocalCoreId, translatorName, InterfaceType::TRANSLATOR);

    auto fid = translatorFedID.load();

    const auto& handle = createBasicHandle(
        fid, LocalFederateId(), InterfaceType::TRANSLATOR, translatorName, endpointType, units);
    auto hid = handle.getInterfaceHandle();

    ActionMessage reg(CMD_REG_TRANSLATOR);
    reg.source_id = fid;
    reg.source_handle = hid;
    reg.name(handle.key);
    if ((!endpointType.empty()) || (!units.empty())) {
        reg.setStringData(endpointType, units);
    }
    actionQueue.push(std::move(reg));
    return hid;
}